

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O2

void btSolveL1(btScalar *L,btScalar *B,int n,int lskip1)

{
  btScalar *pbVar1;
  btScalar *pbVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  btScalar *pbVar15;
  btScalar *pbVar16;
  btScalar *pbVar17;
  btScalar *pbVar18;
  ulong uVar19;
  ulong uVar20;
  btScalar *pbVar21;
  long lVar22;
  btScalar *pbVar23;
  btScalar *pbVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  long lVar28;
  btScalar *pbVar29;
  btScalar *pbVar30;
  btScalar *pbVar31;
  btScalar *pbVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  btScalar *local_138;
  btScalar *local_120;
  btScalar *local_110;
  btScalar *local_108;
  btScalar *local_100;
  btScalar *local_f8;
  btScalar *local_f0;
  btScalar *local_e8;
  btScalar *local_e0;
  btScalar *local_d8;
  btScalar *local_d0;
  btScalar *local_c8;
  btScalar *local_c0;
  btScalar *local_a0;
  btScalar *local_98;
  btScalar *local_90;
  btScalar *local_88;
  btScalar *local_80;
  btScalar *local_78;
  btScalar *local_70;
  btScalar *local_68;
  
  lVar22 = (long)lskip1;
  local_68 = L + (lskip1 * 3 + 0xb);
  pbVar29 = L + (long)(lskip1 * 2 + 10) + 1;
  local_70 = L + (lskip1 + 0xb);
  local_78 = L + (lskip1 * 3 + 10);
  local_80 = L + (lskip1 + 10);
  local_88 = L + (lskip1 * 3 + 9);
  pbVar31 = L + (long)(lskip1 * 2 + 8) + 1;
  local_90 = L + (lskip1 + 9);
  local_98 = L + (lskip1 * 3 + 8);
  local_a0 = L + (lskip1 + 8);
  local_c0 = L + (lskip1 * 3 + 7);
  pbVar16 = L + (long)(lskip1 * 2 + 6) + 1;
  local_c8 = L + (lskip1 + 7);
  local_d0 = L + (lskip1 * 3 + 6);
  local_d8 = L + (lskip1 + 6);
  local_e0 = L + (lskip1 * 3 + 5);
  pbVar32 = L + (long)(lskip1 * 2 + 4) + 1;
  local_e8 = L + (lskip1 + 5);
  local_f0 = L + (lskip1 * 3 + 4);
  local_f8 = L + (lskip1 + 4);
  local_100 = L + (lskip1 * 3 + 3);
  pbVar18 = L + (long)(lskip1 * 2 + 2) + 1;
  local_108 = L + (lskip1 + 3);
  local_110 = L + (lskip1 + 2);
  pbVar2 = L + (long)(lskip1 * 2) + 1;
  local_120 = L + (lskip1 + 1);
  pbVar17 = L + lskip1 * 3;
  pbVar1 = L + lVar22;
  lVar28 = 0;
  pbVar15 = L;
  pbVar21 = L + (lskip1 * 3 + 1);
  pbVar23 = pbVar2;
  pbVar24 = L + (lskip1 * 3 + 2);
  pbVar30 = pbVar17;
  local_138 = pbVar1;
  for (uVar20 = 0; (long)uVar20 <= (long)(n + -4); uVar20 = uVar20 + 4) {
    fVar33 = 0.0;
    fVar34 = 0.0;
    fVar35 = 0.0;
    fVar36 = 0.0;
    lVar25 = 0;
    lVar27 = lVar28;
    for (uVar19 = uVar20; 0xb < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 0xc)) {
      fVar3 = *(float *)((long)B + lVar25);
      fVar4 = *(float *)((long)B + lVar25 + 4);
      fVar5 = *(float *)((long)B + lVar25 + 8);
      fVar6 = *(float *)((long)B + lVar25 + 0xc);
      fVar7 = *(float *)((long)B + lVar25 + 0x10);
      fVar8 = *(float *)((long)B + lVar25 + 0x14);
      fVar9 = *(float *)((long)B + lVar25 + 0x18);
      fVar10 = *(float *)((long)B + lVar25 + 0x1c);
      fVar11 = *(float *)((long)B + lVar25 + 0x20);
      fVar12 = *(float *)((long)B + lVar25 + 0x24);
      fVar13 = *(float *)((long)B + lVar25 + 0x28);
      fVar14 = *(float *)((long)B + lVar25 + 0x2c);
      fVar33 = fVar14 * *(float *)((long)pbVar29 + lVar25) +
               fVar13 * *(float *)((long)pbVar29 + lVar25 + -4) +
               fVar12 * *(float *)((long)pbVar31 + lVar25) +
               fVar11 * *(float *)((long)pbVar31 + lVar25 + -4) +
               fVar10 * *(float *)((long)pbVar16 + lVar25) +
               fVar9 * *(float *)((long)pbVar16 + lVar25 + -4) +
               fVar8 * *(float *)((long)pbVar32 + lVar25) +
               fVar7 * *(float *)((long)pbVar32 + lVar25 + -4) +
               fVar6 * *(float *)((long)pbVar18 + lVar25) +
               fVar5 * *(float *)((long)pbVar18 + lVar25 + -4) +
               *(float *)((long)pbVar23 + lVar25) * fVar4 +
               *(float *)((long)pbVar23 + lVar25 + -4) * fVar3 + fVar33;
      fVar34 = fVar14 * *(float *)((long)local_68 + lVar25) +
               fVar13 * *(float *)((long)local_78 + lVar25) +
               fVar12 * *(float *)((long)local_88 + lVar25) +
               fVar11 * *(float *)((long)local_98 + lVar25) +
               fVar10 * *(float *)((long)local_c0 + lVar25) +
               fVar9 * *(float *)((long)local_d0 + lVar25) +
               fVar8 * *(float *)((long)local_e0 + lVar25) +
               fVar7 * *(float *)((long)local_f0 + lVar25) +
               fVar6 * *(float *)((long)local_100 + lVar25) +
               fVar5 * *(float *)((long)pbVar24 + lVar25) +
               fVar4 * *(float *)((long)pbVar21 + lVar25) +
               fVar3 * *(float *)((long)pbVar30 + lVar25) + fVar34;
      fVar35 = fVar14 * *(float *)((long)local_70 + lVar25) +
               fVar13 * *(float *)((long)local_80 + lVar25) +
               fVar12 * *(float *)((long)local_90 + lVar25) +
               fVar11 * *(float *)((long)local_a0 + lVar25) +
               fVar10 * *(float *)((long)local_c8 + lVar25) +
               fVar9 * *(float *)((long)local_d8 + lVar25) +
               fVar8 * *(float *)((long)local_e8 + lVar25) +
               fVar7 * *(float *)((long)local_f8 + lVar25) +
               fVar6 * *(float *)((long)local_108 + lVar25) +
               fVar5 * *(float *)((long)local_110 + lVar25) +
               *(float *)((long)local_120 + lVar25) * fVar4 +
               *(float *)((long)local_138 + lVar25) * fVar3 + fVar35;
      fVar36 = fVar14 * *(float *)((long)pbVar15 + lVar25 + 0x2c) +
               fVar13 * *(float *)((long)pbVar15 + lVar25 + 0x28) +
               fVar12 * *(float *)((long)pbVar15 + lVar25 + 0x24) +
               fVar11 * *(float *)((long)pbVar15 + lVar25 + 0x20) +
               fVar10 * *(float *)((long)pbVar15 + lVar25 + 0x1c) +
               fVar9 * *(float *)((long)pbVar15 + lVar25 + 0x18) +
               fVar8 * *(float *)((long)pbVar15 + lVar25 + 0x14) +
               fVar7 * *(float *)((long)pbVar15 + lVar25 + 0x10) +
               fVar6 * *(float *)((long)pbVar15 + lVar25 + 0xc) +
               fVar5 * *(float *)((long)pbVar15 + lVar25 + 8) +
               *(float *)((long)pbVar15 + lVar25 + 4) * fVar4 +
               *(float *)((long)pbVar15 + lVar25) * fVar3 + fVar36;
      lVar25 = lVar25 + 0x30;
      lVar27 = lVar27 + 0x30;
    }
    pfVar26 = (float *)(lVar25 + (long)B);
    for (; 0 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
      fVar3 = *pfVar26;
      fVar33 = fVar33 + fVar3 * *(float *)((long)pbVar2 + lVar27 + -4);
      fVar34 = fVar34 + fVar3 * *(float *)((long)pbVar17 + lVar27);
      fVar35 = fVar35 + fVar3 * *(float *)((long)pbVar1 + lVar27);
      fVar36 = fVar36 + fVar3 * *(float *)((long)L + lVar27);
      pfVar26 = pfVar26 + 1;
      lVar27 = lVar27 + 4;
    }
    fVar36 = *pfVar26 - fVar36;
    *pfVar26 = fVar36;
    fVar35 = (pfVar26[1] - fVar35) - *(float *)((long)pbVar1 + lVar27) * fVar36;
    pfVar26[1] = fVar35;
    fVar33 = ((pfVar26[2] - fVar33) - *(float *)((long)pbVar2 + lVar27 + -4) * fVar36) -
             *(float *)((long)pbVar2 + lVar27) * fVar35;
    pfVar26[2] = fVar33;
    pfVar26[3] = (((pfVar26[3] - fVar34) - fVar36 * *(float *)((long)pbVar17 + lVar27)) -
                 fVar35 * *(float *)((long)(L + (lskip1 * 3 + 1)) + lVar27)) -
                 fVar33 * *(float *)((long)(L + (lskip1 * 3 + 2)) + lVar27);
    pbVar15 = pbVar15 + lVar22 * 4;
    local_68 = local_68 + lVar22 * 4;
    pbVar29 = pbVar29 + lVar22 * 4;
    local_70 = local_70 + lVar22 * 4;
    local_78 = local_78 + lVar22 * 4;
    local_80 = local_80 + lVar22 * 4;
    local_88 = local_88 + lVar22 * 4;
    pbVar31 = pbVar31 + lVar22 * 4;
    local_90 = local_90 + lVar22 * 4;
    local_98 = local_98 + lVar22 * 4;
    local_a0 = local_a0 + lVar22 * 4;
    local_c0 = local_c0 + lVar22 * 4;
    pbVar16 = pbVar16 + lVar22 * 4;
    local_c8 = local_c8 + lVar22 * 4;
    local_d0 = local_d0 + lVar22 * 4;
    local_d8 = local_d8 + lVar22 * 4;
    local_e0 = local_e0 + lVar22 * 4;
    pbVar32 = pbVar32 + lVar22 * 4;
    local_e8 = local_e8 + lVar22 * 4;
    local_f0 = local_f0 + lVar22 * 4;
    local_f8 = local_f8 + lVar22 * 4;
    local_100 = local_100 + lVar22 * 4;
    pbVar18 = pbVar18 + lVar22 * 4;
    local_108 = local_108 + lVar22 * 4;
    pbVar24 = pbVar24 + lVar22 * 4;
    local_110 = local_110 + lVar22 * 4;
    pbVar21 = pbVar21 + lVar22 * 4;
    pbVar23 = pbVar23 + lVar22 * 4;
    local_120 = local_120 + lVar22 * 4;
    pbVar30 = pbVar30 + lVar22 * 4;
    local_138 = local_138 + lVar22 * 4;
    lVar28 = lVar28 + lVar22 * 0x10;
  }
  for (; (long)uVar20 < (long)n; uVar20 = uVar20 + 1) {
    pfVar26 = L + uVar20 * lVar22;
    fVar33 = 0.0;
    pbVar17 = B;
    for (uVar19 = uVar20 & 0xffffffff; 0xb < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 0xc)) {
      fVar33 = pfVar26[0xb] * pbVar17[0xb] +
               pfVar26[10] * pbVar17[10] +
               pfVar26[9] * pbVar17[9] +
               pfVar26[8] * pbVar17[8] +
               pfVar26[7] * pbVar17[7] +
               pfVar26[6] * pbVar17[6] +
               pfVar26[5] * pbVar17[5] +
               pfVar26[4] * pbVar17[4] +
               pfVar26[3] * pbVar17[3] +
               pfVar26[2] * pbVar17[2] + pfVar26[1] * pbVar17[1] + *pfVar26 * *pbVar17 + fVar33;
      pfVar26 = pfVar26 + 0xc;
      pbVar17 = pbVar17 + 0xc;
    }
    lVar28 = 0;
    for (; 0 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
      fVar33 = fVar33 + *(float *)((long)pfVar26 + lVar28) * *(float *)((long)pbVar17 + lVar28);
      lVar28 = lVar28 + 4;
    }
    *(float *)((long)pbVar17 + lVar28) = *(float *)((long)pbVar17 + lVar28) - fVar33;
  }
  return;
}

Assistant:

void btSolveL1 (const btScalar *L, btScalar *B, int n, int lskip1)
{  
  /* declare variables - Z matrix, p and q vectors, etc */
  btScalar Z11,Z21,Z31,Z41,p1,q1,p2,p3,p4,*ex;
  const btScalar *ell;
  int lskip2,lskip3,i,j;
  /* compute lskip values */
  lskip2 = 2*lskip1;
  lskip3 = 3*lskip1;
  /* compute all 4 x 1 blocks of X */
  for (i=0; i <= n-4; i+=4) {
    /* compute all 4 x 1 block of X, from rows i..i+4-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    Z21=0;
    Z31=0;
    Z41=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      p2=ell[1+lskip1];
      p3=ell[1+lskip2];
      p4=ell[1+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      p2=ell[2+lskip1];
      p3=ell[2+lskip2];
      p4=ell[2+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      p2=ell[3+lskip1];
      p3=ell[3+lskip2];
      p4=ell[3+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      p2=ell[4+lskip1];
      p3=ell[4+lskip2];
      p4=ell[4+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      p2=ell[5+lskip1];
      p3=ell[5+lskip2];
      p4=ell[5+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      p2=ell[6+lskip1];
      p3=ell[6+lskip2];
      p4=ell[6+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      p2=ell[7+lskip1];
      p3=ell[7+lskip2];
      p4=ell[7+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      p2=ell[8+lskip1];
      p3=ell[8+lskip2];
      p4=ell[8+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      p2=ell[9+lskip1];
      p3=ell[9+lskip2];
      p4=ell[9+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      p2=ell[10+lskip1];
      p3=ell[10+lskip2];
      p4=ell[10+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      p2=ell[11+lskip1];
      p3=ell[11+lskip2];
      p4=ell[11+lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      p2=ell[lskip1];
      p3=ell[lskip2];
      p4=ell[lskip3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      Z21 += p2 * q1;
      Z31 += p3 * q1;
      Z41 += p4 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
    p1 = ell[lskip1];
    Z21 = ex[1] - Z21 - p1*Z11;
    ex[1] = Z21;
    p1 = ell[lskip2];
    p2 = ell[1+lskip2];
    Z31 = ex[2] - Z31 - p1*Z11 - p2*Z21;
    ex[2] = Z31;
    p1 = ell[lskip3];
    p2 = ell[1+lskip3];
    p3 = ell[2+lskip3];
    Z41 = ex[3] - Z41 - p1*Z11 - p2*Z21 - p3*Z31;
    ex[3] = Z41;
    /* end of outer loop */
  }
  /* compute rows at end that are not a multiple of block size */
  for (; i < n; i++) {
    /* compute all 1 x 1 block of X, from rows i..i+1-1 */
    /* set the Z matrix to 0 */
    Z11=0;
    ell = L + i*lskip1;
    ex = B;
    /* the inner loop that computes outer products and adds them to Z */
    for (j=i-12; j >= 0; j -= 12) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[1];
      q1=ex[1];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[2];
      q1=ex[2];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[3];
      q1=ex[3];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[4];
      q1=ex[4];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[5];
      q1=ex[5];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[6];
      q1=ex[6];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[7];
      q1=ex[7];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[8];
      q1=ex[8];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[9];
      q1=ex[9];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[10];
      q1=ex[10];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* load p and q values */
      p1=ell[11];
      q1=ex[11];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 12;
      ex += 12;
      /* end of inner loop */
    }
    /* compute left-over iterations */
    j += 12;
    for (; j > 0; j--) {
      /* load p and q values */
      p1=ell[0];
      q1=ex[0];
      /* compute outer product and add it to the Z matrix */
      Z11 += p1 * q1;
      /* advance pointers */
      ell += 1;
      ex += 1;
    }
    /* finish computing the X(i) block */
    Z11 = ex[0] - Z11;
    ex[0] = Z11;
  }
}